

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O2

Vec_Int_t * Gla_ManCollectPPis(Gla_Man_t *p,Vec_Int_t *vPis)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  Gla_Obj_t *pGVar5;
  Gla_Obj_t *pGVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  
  p_00 = Vec_IntAlloc(1000);
  iVar9 = 0;
  while( true ) {
    if (p->vAbs->nSize <= iVar9) {
      Vec_IntUniqify(p_00);
      iVar9 = p_00->nSize;
      iVar3 = iVar9 / 2;
      for (lVar7 = 0; iVar9 = iVar9 + -1, lVar7 < iVar3; lVar7 = lVar7 + 1) {
        piVar2 = p_00->pArray;
        iVar1 = piVar2[lVar7];
        piVar2[lVar7] = piVar2[iVar9];
        piVar2[iVar9] = iVar1;
      }
      return p_00;
    }
    iVar3 = Vec_IntEntry(p->vAbs,iVar9);
    pGVar5 = Gla_ManObj(p,iVar3);
    uVar4 = *(uint *)&pGVar5->field_0x4;
    if ((uVar4 & 0xa4) == 0) break;
    for (uVar8 = 0; uVar8 < uVar4 >> 9; uVar8 = uVar8 + 1) {
      pGVar6 = Gla_ManObj(p,pGVar5->Fanins[uVar8]);
      if ((pGVar6->field_0x4 & 9) == 0) {
        Vec_IntPush(p_00,pGVar5->Fanins[uVar8]);
      }
      uVar4 = *(uint *)&pGVar5->field_0x4;
    }
    iVar9 = iVar9 + 1;
  }
  __assert_fail("pObj->fConst || pObj->fRo || pObj->fAnd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                ,0x4dc,"Vec_Int_t *Gla_ManCollectPPis(Gla_Man_t *, Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Gla_ManCollectPPis( Gla_Man_t * p, Vec_Int_t * vPis )
{
    Vec_Int_t * vPPis;
    Gla_Obj_t * pObj, * pFanin;
    int i, k;
    vPPis = Vec_IntAlloc( 1000 );
    if ( vPis )
        Vec_IntClear( vPis );
    Gla_ManForEachObjAbs( p, pObj, i )
    {
        assert( pObj->fConst || pObj->fRo || pObj->fAnd );
        Gla_ObjForEachFanin( p, pObj, pFanin, k )
            if ( !pFanin->fPi && !pFanin->fAbs )
                Vec_IntPush( vPPis, pObj->Fanins[k] );
            else if ( vPis && pFanin->fPi && !pFanin->fAbs )
                Vec_IntPush( vPis, pObj->Fanins[k] );
    }
    Vec_IntUniqify( vPPis );
    Vec_IntReverseOrder( vPPis );
    if ( vPis )
        Vec_IntUniqify( vPis );
    return vPPis;
}